

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O2

ptr<FakeClient> __thiscall nuraft::FakeNetwork::findClient(FakeNetwork *this,string *endpoint)

{
  iterator iVar1;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<FakeClient> pVar2;
  
  std::mutex::lock((mutex *)&endpoint[4].field_2);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                  *)(endpoint + 3),in_RDX);
  if (iVar1._M_node == (_Base_ptr)&endpoint[3]._M_string_length) {
    (this->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)0x0;
    (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)0x0;
  }
  else {
    std::__shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&endpoint[4].field_2);
  pVar2.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<FakeClient>)pVar2.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<FakeClient> FakeNetwork::findClient(const std::string& endpoint) {
    std::lock_guard<std::mutex> ll(clientsLock);
    auto entry = clients.find(endpoint);
    if (entry == clients.end()) return nullptr;
    return entry->second;
}